

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall YAML::BadPushback::BadPushback(BadPushback *this)

{
  allocator local_49;
  string local_48;
  Mark local_28;
  
  local_28.pos = -1;
  local_28.line = -1;
  local_28.column = -1;
  std::__cxx11::string::string((string *)&local_48,"appending to a non-sequence",&local_49);
  RepresentationException::RepresentationException
            (&this->super_RepresentationException,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_RepresentationException).super_Exception =
       &PTR__BadConversion_00827b68;
  return;
}

Assistant:

BadPushback(const BadPushback&) = default;